

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

int __thiscall booster::aio::basic_socket::open(basic_socket *this,char *__file,int __oflag,...)

{
  error_code eVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined8 uVar3;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code local_20;
  int local_10;
  uint local_c;
  basic_socket *local_8;
  
  local_c = (uint)__file;
  local_10 = __oflag;
  local_8 = this;
  std::error_code::error_code((error_code *)this);
  open(this,(char *)(ulong)local_c,local_10,&local_20);
  bVar2 = std::error_code::operator_cast_to_bool(&local_20);
  if (!bVar2) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = local_20._M_cat;
  eVar1._M_value = local_20._M_value;
  eVar1._4_4_ = local_20._4_4_;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_socket::open(family_type d,socket_type t)
{
	system::error_code e;
	open(d,t,e);
	if(e)
		throw system::system_error(e);
}